

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

bool __thiscall
ON_BezierCurve::GetBoundingBox(ON_BezierCurve *this,ON_BoundingBox *bbox,int bGrowBox)

{
  bool bVar1;
  ON_BoundingBox *__s;
  uint dim;
  ON_3dPoint *boxmax;
  ON_BoundingBox *boxmin;
  
  dim = this->m_dim;
  if ((int)dim < 4) {
    boxmax = &bbox->m_max;
    __s = (ON_BoundingBox *)0x0;
    boxmin = bbox;
  }
  else {
    __s = (ON_BoundingBox *)onmalloc((ulong)dim << 4);
    memset(__s,0,(long)this->m_dim << 4);
    dim = this->m_dim;
    boxmax = (ON_3dPoint *)(&(__s->m_min).x + (int)dim);
    boxmin = __s;
    if (bGrowBox != 0) {
      (__s->m_min).x = (bbox->m_min).x;
      (__s->m_min).y = (bbox->m_min).y;
      (__s->m_min).z = (bbox->m_min).z;
      boxmax->x = (bbox->m_max).x;
      boxmax->y = (bbox->m_max).y;
      boxmax->z = (bbox->m_max).z;
    }
  }
  bVar1 = ON_GetPointListBoundingBox
                    (dim,this->m_is_rat != 0,this->m_order,this->m_cv_stride,this->m_cv,
                     (double *)boxmin,&boxmax->x,(uint)(bGrowBox != 0));
  if ((bVar1) && (3 < this->m_dim)) {
    ON_3dPoint::operator=(&bbox->m_min,(double *)boxmin);
    ON_3dPoint::operator=(&bbox->m_max,&boxmax->x);
  }
  if (__s != (ON_BoundingBox *)0x0) {
    onfree(__s);
  }
  return bVar1;
}

Assistant:

bool ON_BezierCurve::GetBoundingBox( // returns true if successful
       ON_BoundingBox& bbox,
       int bGrowBox             // true means grow box
       ) const
{
  void* heap_buffer = 0;
  double *boxmin, *boxmax;
  
  if ( m_dim > 3 ) 
  {
    heap_buffer = onmalloc(2*m_dim*sizeof(*boxmin));
    boxmin = (double*)heap_buffer;
    memset( boxmin, 0, 2*m_dim*sizeof(*boxmin) );
    boxmax = boxmin + m_dim;
    if ( bGrowBox ) 
    {
      boxmin[0] = bbox.m_min.x;
      boxmin[1] = bbox.m_min.y;
      boxmin[2] = bbox.m_min.z;
      boxmax[0] = bbox.m_max.x;
      boxmax[1] = bbox.m_max.y;
      boxmax[2] = bbox.m_max.z;
    }
  }
  else 
  {
    boxmin = &bbox.m_min.x;
    boxmax = &bbox.m_max.x;
  }
  
  bool rc = GetBBox( boxmin, boxmax, bGrowBox );
  
  if ( rc && m_dim > 3 ) 
  {
    bbox.m_min = boxmin;
    bbox.m_max = boxmax;
  }

  if ( 0 != heap_buffer )
    onfree(heap_buffer);

  return rc;
}